

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O2

idx_t duckdb::BinaryExecutor::
      SelectFlatLoop<signed_char,signed_char,duckdb::GreaterThan,true,false,false,true>
                (char *ldata,char *rdata,SelectionVector *sel,idx_t count,
                ValidityMask *validity_mask,SelectionVector *true_sel,SelectionVector *false_sel)

{
  char cVar1;
  char cVar2;
  unsigned_long *puVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  idx_t entry_idx;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  
  puVar3 = (validity_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  uVar8 = 0;
  uVar10 = 0;
  lVar4 = 0;
  do {
    if (uVar8 == count + 0x3f >> 6) {
      return count - lVar4;
    }
    if (puVar3 == (unsigned_long *)0x0) {
      uVar11 = uVar10 + 0x40;
      if (count <= uVar10 + 0x40) {
        uVar11 = count;
      }
LAB_013d4071:
      for (; uVar6 = uVar10, uVar10 < uVar11; uVar10 = uVar10 + 1) {
        if (sel->sel_vector != (sel_t *)0x0) {
          uVar6 = (ulong)sel->sel_vector[uVar10];
        }
        cVar1 = *ldata;
        cVar2 = rdata[uVar10];
        false_sel->sel_vector[lVar4] = (sel_t)uVar6;
        lVar4 = lVar4 + (ulong)(cVar1 <= cVar2);
      }
    }
    else {
      uVar6 = puVar3[uVar8];
      uVar11 = uVar10 + 0x40;
      if (count <= uVar10 + 0x40) {
        uVar11 = count;
      }
      if (uVar6 == 0xffffffffffffffff) goto LAB_013d4071;
      if (uVar6 == 0) {
        for (; uVar6 = uVar11, uVar10 < uVar11; uVar10 = uVar10 + 1) {
          uVar6 = uVar10;
          if (sel->sel_vector != (sel_t *)0x0) {
            uVar6 = (ulong)sel->sel_vector[uVar10];
          }
          false_sel->sel_vector[lVar4] = (sel_t)uVar6;
          lVar4 = lVar4 + 1;
        }
      }
      else {
        for (uVar5 = 0; uVar7 = uVar10 + uVar5, uVar7 < uVar11; uVar5 = uVar5 + 1) {
          if (sel->sel_vector != (sel_t *)0x0) {
            uVar7 = (ulong)sel->sel_vector[uVar10 + uVar5];
          }
          uVar9 = 1;
          if ((uVar6 >> (uVar5 & 0x3f) & 1) != 0) {
            uVar9 = (ulong)(*ldata <= rdata[uVar5 + uVar10]);
          }
          false_sel->sel_vector[lVar4] = (sel_t)uVar7;
          lVar4 = lVar4 + uVar9;
        }
        uVar6 = uVar10 + uVar5;
      }
    }
    uVar10 = uVar6;
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

static inline idx_t SelectFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                   const SelectionVector *sel, idx_t count, ValidityMask &validity_mask,
	                                   SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		idx_t base_idx = 0;
		auto entry_count = ValidityMask::EntryCount(count);
		for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
			auto validity_entry = validity_mask.GetValidityEntry(entry_idx);
			idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
			if (ValidityMask::AllValid(validity_entry)) {
				// all valid: perform operation
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			} else if (ValidityMask::NoneValid(validity_entry)) {
				// nothing valid: skip all
				if (HAS_FALSE_SEL) {
					for (; base_idx < next; base_idx++) {
						idx_t result_idx = sel->get_index(base_idx);
						false_sel->set_index(false_count, result_idx);
						false_count++;
					}
				}
				base_idx = next;
				continue;
			} else {
				// partially valid: need to check individual elements for validity
				idx_t start = base_idx;
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = ValidityMask::RowIsValid(validity_entry, base_idx - start) &&
					                         OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}